

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

void js_std_init_handlers(JSRuntime *rt)

{
  void *opaque;
  undefined4 *puVar1;
  long lVar2;
  JSSharedArrayBufferFunctions local_28;
  
  lVar2 = 0x58;
  opaque = calloc(1,0x58);
  if (opaque == (void *)0x0) {
    js_std_init_handlers_cold_1();
    puVar1 = (undefined4 *)malloc(lVar2 + 8);
    if (puVar1 != (undefined4 *)0x0) {
      *puVar1 = 1;
    }
    return;
  }
  *(void **)opaque = opaque;
  *(void **)((long)opaque + 8) = opaque;
  *(long *)((long)opaque + 0x10) = (long)opaque + 0x10;
  *(long *)((long)opaque + 0x18) = (long)opaque + 0x10;
  *(long *)((long)opaque + 0x20) = (long)opaque + 0x20;
  *(long *)((long)opaque + 0x28) = (long)opaque + 0x20;
  *(long *)((long)opaque + 0x30) = (long)opaque + 0x30;
  *(long *)((long)opaque + 0x38) = (long)opaque + 0x30;
  JS_SetRuntimeOpaque(rt,opaque);
  local_28.sab_opaque = (void *)0x0;
  local_28.sab_alloc = js_sab_alloc;
  local_28.sab_free = js_sab_free;
  local_28.sab_dup = js_sab_dup;
  JS_SetSharedArrayBufferFunctions(rt,&local_28);
  return;
}

Assistant:

void js_std_init_handlers(JSRuntime *rt)
{
    JSThreadState *ts;

    ts = malloc(sizeof(*ts));
    if (!ts) {
        fprintf(stderr, "Could not allocate memory for the worker");
        exit(1);
    }
    memset(ts, 0, sizeof(*ts));
    init_list_head(&ts->os_rw_handlers);
    init_list_head(&ts->os_signal_handlers);
    init_list_head(&ts->os_timers);
    init_list_head(&ts->port_list);

    JS_SetRuntimeOpaque(rt, ts);

#ifdef USE_WORKER
    /* set the SharedArrayBuffer memory handlers */
    {
        JSSharedArrayBufferFunctions sf;
        memset(&sf, 0, sizeof(sf));
        sf.sab_alloc = js_sab_alloc;
        sf.sab_free = js_sab_free;
        sf.sab_dup = js_sab_dup;
        JS_SetSharedArrayBufferFunctions(rt, &sf);
    }
#endif
}